

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O0

ReturnType __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::map_or<____C_A_T_C_H____T_E_S_T____28()::__0&,int>
          (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
           *this,anon_class_1_0_00000001 *fn,int *alternative)

{
  ReturnType RVar1;
  int *alternative_local;
  anon_class_1_0_00000001 *fn_local;
  impl<ezy::strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>_>
  *this_local;
  
  RVar1 = _impl::
          map_or<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>,____C_A_T_C_H____T_E_S_T____28()::__0&,int>
                    ((strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
                      *)this,fn,alternative);
  return RVar1;
}

Assistant:

decltype(auto) map_or(Fn&& fn, Alternative&& alternative) &&
      {
        return _impl::map_or(static_cast<T&&>(*this), std::forward<Fn>(fn), std::forward<Alternative>(alternative));
      }